

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator<
               (Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                *c1,Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                    *c2)

{
  uint uVar1;
  uint uVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  pointer ppEVar5;
  
  if (c1 == c2) {
    return false;
  }
  ppEVar4 = (c1->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar5 = (c2->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar3 = (c2->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if ((ppEVar4 ==
         (c1->column_).
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) || (ppEVar5 == ppEVar3)) {
      return ppEVar5 != ppEVar3;
    }
    uVar1 = (*ppEVar5)->rowIndex_;
    uVar2 = (*ppEVar4)->rowIndex_;
    if (uVar2 != uVar1) {
      return uVar2 < uVar1;
    }
    uVar1 = ((*ppEVar5)->super_Entry_field_element_option).element_;
    uVar2 = ((*ppEVar4)->super_Entry_field_element_option).element_;
    if (uVar2 != uVar1) break;
    ppEVar4 = ppEVar4 + 1;
    ppEVar5 = ppEVar5 + 1;
  }
  return uVar2 < uVar1;
}

Assistant:

bool operator<(const Naive_vector_column& c1, const Naive_vector_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    return it2 != c2.column_.end();
  }